

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxGlobalVariable::FxGlobalVariable(FxGlobalVariable *this,PField *mem,FScriptPosition *pos)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_GlobalVariable;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c7f8;
  this->membervar = mem;
  this->AddressRequested = false;
  this->AddressWritable = true;
  return;
}

Assistant:

FxGlobalVariable::FxGlobalVariable(PField* mem, const FScriptPosition &pos)
	: FxExpression(EFX_GlobalVariable, pos)
{
	membervar = mem;
	AddressRequested = false;
	AddressWritable = true;	// must be true unless classx tells us otherwise if requested.
}